

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

bool embree::avx512::
     BVHNIntersector1<8,_1,_true,_embree::avx512::ArrayIntersector1<embree::avx512::QuadMiIntersector1Pluecker<4,_true>_>_>
     ::pointQuery(Intersectors *This,PointQuery *query,PointQueryContext *context)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined4 uVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  uint uVar7;
  Geometry *this;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  bool bVar26;
  byte bVar27;
  bool bVar28;
  int iVar29;
  ulong uVar30;
  long lVar31;
  ulong *puVar32;
  byte bVar33;
  size_t i;
  long lVar34;
  long lVar35;
  ulong uVar36;
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [64];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 in_ZMM7 [64];
  undefined1 auVar52 [16];
  undefined1 auVar53 [64];
  undefined1 in_ZMM10 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  ulong local_2378;
  undefined4 local_2370 [2];
  ulong local_2368 [1127];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 == 8) {
    return false;
  }
  local_2378 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  local_2370[0] = 0;
  if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
    auVar53 = ZEXT464((uint)(query->radius * query->radius));
  }
  else {
    aVar6 = (context->query_radius).field_0;
    auVar52 = vdpps_avx((undefined1  [16])aVar6,(undefined1  [16])aVar6,0x7f);
    auVar53 = ZEXT1664(auVar52);
  }
  puVar32 = local_2368;
  fVar2 = (query->p).field_0.field_0.x;
  auVar50._4_4_ = fVar2;
  auVar50._0_4_ = fVar2;
  auVar50._8_4_ = fVar2;
  auVar50._12_4_ = fVar2;
  auVar50._16_4_ = fVar2;
  auVar50._20_4_ = fVar2;
  auVar50._24_4_ = fVar2;
  auVar50._28_4_ = fVar2;
  fVar3 = (query->p).field_0.field_0.y;
  auVar49._4_4_ = fVar3;
  auVar49._0_4_ = fVar3;
  auVar49._8_4_ = fVar3;
  auVar49._12_4_ = fVar3;
  auVar49._16_4_ = fVar3;
  auVar49._20_4_ = fVar3;
  auVar49._24_4_ = fVar3;
  auVar49._28_4_ = fVar3;
  fVar4 = *(float *)((long)&(query->p).field_0 + 8);
  uVar5 = *(undefined4 *)&(context->query_radius).field_0;
  auVar44._4_4_ = uVar5;
  auVar44._0_4_ = uVar5;
  auVar44._8_4_ = uVar5;
  auVar44._12_4_ = uVar5;
  auVar44._16_4_ = uVar5;
  auVar44._20_4_ = uVar5;
  auVar44._24_4_ = uVar5;
  auVar44._28_4_ = uVar5;
  uVar5 = *(undefined4 *)((long)&(context->query_radius).field_0 + 4);
  auVar45._4_4_ = uVar5;
  auVar45._0_4_ = uVar5;
  auVar45._8_4_ = uVar5;
  auVar45._12_4_ = uVar5;
  auVar45._16_4_ = uVar5;
  auVar45._20_4_ = uVar5;
  auVar45._24_4_ = uVar5;
  auVar45._28_4_ = uVar5;
  uVar5 = *(undefined4 *)((long)&(context->query_radius).field_0 + 8);
  auVar39._4_4_ = uVar5;
  auVar39._0_4_ = uVar5;
  auVar39._8_4_ = uVar5;
  auVar39._12_4_ = uVar5;
  auVar39._16_4_ = uVar5;
  auVar39._20_4_ = uVar5;
  auVar39._24_4_ = uVar5;
  auVar39._28_4_ = uVar5;
  bVar28 = false;
  auVar18 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
  auVar55 = ZEXT3264(auVar18);
  auVar56 = ZEXT3264(CONCAT428(0xfffffff8,
                               CONCAT424(0xfffffff8,
                                         CONCAT420(0xfffffff8,
                                                   CONCAT416(0xfffffff8,
                                                             CONCAT412(0xfffffff8,
                                                                       CONCAT48(0xfffffff8,
                                                                                0xfffffff8fffffff8))
                                                            )))));
  do {
    auVar18 = vsubps_avx(auVar50,auVar44);
    fVar8 = auVar44._0_4_;
    fVar9 = auVar44._4_4_;
    fVar10 = auVar44._8_4_;
    fVar11 = auVar44._12_4_;
    fVar12 = auVar44._16_4_;
    fVar13 = auVar44._20_4_;
    fVar14 = auVar44._24_4_;
    auVar16 = vsubps_avx(auVar49,auVar45);
    auVar17._4_4_ = fVar4;
    auVar17._0_4_ = fVar4;
    auVar17._8_4_ = fVar4;
    auVar17._12_4_ = fVar4;
    auVar17._16_4_ = fVar4;
    auVar17._20_4_ = fVar4;
    auVar17._24_4_ = fVar4;
    auVar17._28_4_ = fVar4;
    auVar17 = vsubps_avx(auVar17,auVar39);
    auVar46._0_4_ = fVar4 + auVar39._0_4_;
    auVar46._4_4_ = fVar4 + auVar39._4_4_;
    auVar46._8_4_ = fVar4 + auVar39._8_4_;
    auVar46._12_4_ = fVar4 + auVar39._12_4_;
    auVar46._16_4_ = fVar4 + auVar39._16_4_;
    auVar46._20_4_ = fVar4 + auVar39._20_4_;
    auVar46._24_4_ = fVar4 + auVar39._24_4_;
    auVar46._28_4_ = fVar4 + auVar39._28_4_;
    auVar54._0_4_ = fVar8 * fVar8;
    auVar54._4_4_ = fVar9 * fVar9;
    auVar54._8_4_ = fVar10 * fVar10;
    auVar54._12_4_ = fVar11 * fVar11;
    auVar54._16_4_ = fVar12 * fVar12;
    auVar54._20_4_ = fVar13 * fVar13;
    auVar54._28_36_ = in_ZMM10._28_36_;
    auVar54._24_4_ = fVar14 * fVar14;
    in_ZMM10 = ZEXT3264(auVar54._0_32_);
    auVar52 = auVar53._0_16_;
    do {
      do {
        do {
          if (puVar32 == &local_2378) {
            return bVar28;
          }
          pfVar1 = (float *)(puVar32 + -1);
          puVar32 = puVar32 + -2;
        } while (auVar53._0_4_ < *pfVar1);
        uVar36 = *puVar32;
        do {
          if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
            if ((uVar36 & 8) == 0) {
              auVar39 = vmaxps_avx(auVar50,*(undefined1 (*) [32])(uVar36 + 0x40));
              auVar39 = vminps_avx(auVar39,*(undefined1 (*) [32])(uVar36 + 0x60));
              auVar37 = vsubps_avx(auVar39,auVar50);
              auVar39 = vmaxps_avx(auVar49,*(undefined1 (*) [32])(uVar36 + 0x80));
              auVar15 = vminps_avx(auVar39,*(undefined1 (*) [32])(uVar36 + 0xa0));
              auVar38._4_4_ = fVar4;
              auVar38._0_4_ = fVar4;
              auVar38._8_4_ = fVar4;
              auVar38._12_4_ = fVar4;
              auVar38._16_4_ = fVar4;
              auVar38._20_4_ = fVar4;
              auVar38._24_4_ = fVar4;
              auVar38._28_4_ = fVar4;
              auVar39 = vmaxps_avx(auVar38,*(undefined1 (*) [32])(uVar36 + 0xc0));
              auVar15 = vsubps_avx(auVar15,auVar49);
              auVar39 = vminps_avx(auVar39,*(undefined1 (*) [32])(uVar36 + 0xe0));
              auVar39 = vsubps_avx(auVar39,auVar38);
              auVar51._0_4_ =
                   auVar37._0_4_ * auVar37._0_4_ + auVar15._0_4_ * auVar15._0_4_ +
                   auVar39._0_4_ * auVar39._0_4_;
              auVar51._4_4_ =
                   auVar37._4_4_ * auVar37._4_4_ + auVar15._4_4_ * auVar15._4_4_ +
                   auVar39._4_4_ * auVar39._4_4_;
              auVar51._8_4_ =
                   auVar37._8_4_ * auVar37._8_4_ + auVar15._8_4_ * auVar15._8_4_ +
                   auVar39._8_4_ * auVar39._8_4_;
              auVar51._12_4_ =
                   auVar37._12_4_ * auVar37._12_4_ + auVar15._12_4_ * auVar15._12_4_ +
                   auVar39._12_4_ * auVar39._12_4_;
              auVar51._16_4_ =
                   auVar37._16_4_ * auVar37._16_4_ + auVar15._16_4_ * auVar15._16_4_ +
                   auVar39._16_4_ * auVar39._16_4_;
              auVar51._20_4_ =
                   auVar37._20_4_ * auVar37._20_4_ + auVar15._20_4_ * auVar15._20_4_ +
                   auVar39._20_4_ * auVar39._20_4_;
              auVar51._24_4_ =
                   auVar37._24_4_ * auVar37._24_4_ + auVar15._24_4_ * auVar15._24_4_ +
                   auVar39._24_4_ * auVar39._24_4_;
              auVar51._28_4_ = auVar37._28_4_ + auVar15._28_4_ + auVar15._28_4_;
              in_ZMM7 = ZEXT3264(auVar51);
              uVar19 = vcmpps_avx512vl(auVar51,in_ZMM10._0_32_,2);
              uVar20 = vcmpps_avx512vl(*(undefined1 (*) [32])(uVar36 + 0x40),
                                       *(undefined1 (*) [32])(uVar36 + 0x60),2);
              This = (Intersectors *)
                     CONCAT44((int)((ulong)This >> 0x20),(uint)(byte)((byte)uVar19 & (byte)uVar20));
            }
          }
          else if ((uVar36 & 8) == 0) {
            auVar39 = *(undefined1 (*) [32])(uVar36 + 0x40);
            auVar15 = *(undefined1 (*) [32])(uVar36 + 0x60);
            auVar37 = vmaxps_avx(auVar50,auVar39);
            auVar37 = vminps_avx(auVar37,auVar15);
            auVar38 = vsubps_avx(auVar37,auVar50);
            auVar37 = vmaxps_avx(auVar49,*(undefined1 (*) [32])(uVar36 + 0x80));
            auVar37 = vminps_avx(auVar37,*(undefined1 (*) [32])(uVar36 + 0xa0));
            auVar51 = vsubps_avx(auVar37,auVar49);
            auVar42._4_4_ = fVar4;
            auVar42._0_4_ = fVar4;
            auVar42._8_4_ = fVar4;
            auVar42._12_4_ = fVar4;
            auVar42._16_4_ = fVar4;
            auVar42._20_4_ = fVar4;
            auVar42._24_4_ = fVar4;
            auVar42._28_4_ = fVar4;
            auVar37 = vmaxps_avx(auVar42,*(undefined1 (*) [32])(uVar36 + 0xc0));
            auVar37 = vminps_avx(auVar37,*(undefined1 (*) [32])(uVar36 + 0xe0));
            auVar37 = vsubps_avx(auVar37,auVar42);
            in_ZMM10 = ZEXT3264(in_ZMM10._0_32_);
            in_ZMM7 = ZEXT3264(CONCAT428(auVar38._28_4_ + auVar51._28_4_ + auVar51._28_4_,
                                         CONCAT424(auVar38._24_4_ * auVar38._24_4_ +
                                                   auVar51._24_4_ * auVar51._24_4_ +
                                                   auVar37._24_4_ * auVar37._24_4_,
                                                   CONCAT420(auVar38._20_4_ * auVar38._20_4_ +
                                                             auVar51._20_4_ * auVar51._20_4_ +
                                                             auVar37._20_4_ * auVar37._20_4_,
                                                             CONCAT416(auVar38._16_4_ *
                                                                       auVar38._16_4_ +
                                                                       auVar51._16_4_ *
                                                                       auVar51._16_4_ +
                                                                       auVar37._16_4_ *
                                                                       auVar37._16_4_,
                                                                       CONCAT412(auVar38._12_4_ *
                                                                                 auVar38._12_4_ +
                                                                                 auVar51._12_4_ *
                                                                                 auVar51._12_4_ +
                                                                                 auVar37._12_4_ *
                                                                                 auVar37._12_4_,
                                                                                 CONCAT48(auVar38.
                                                  _8_4_ * auVar38._8_4_ +
                                                  auVar51._8_4_ * auVar51._8_4_ +
                                                  auVar37._8_4_ * auVar37._8_4_,
                                                  CONCAT44(auVar38._4_4_ * auVar38._4_4_ +
                                                           auVar51._4_4_ * auVar51._4_4_ +
                                                           auVar37._4_4_ * auVar37._4_4_,
                                                           auVar38._0_4_ * auVar38._0_4_ +
                                                           auVar51._0_4_ * auVar51._0_4_ +
                                                           auVar37._0_4_ * auVar37._0_4_))))))));
            uVar19 = vcmpps_avx512vl(auVar39,auVar15,2);
            uVar20 = vcmpps_avx512vl(auVar15,auVar18,1);
            auVar37._4_4_ = fVar2 + fVar9;
            auVar37._0_4_ = fVar2 + fVar8;
            auVar37._8_4_ = fVar2 + fVar10;
            auVar37._12_4_ = fVar2 + fVar11;
            auVar37._16_4_ = fVar2 + fVar12;
            auVar37._20_4_ = fVar2 + fVar13;
            auVar37._24_4_ = fVar2 + fVar14;
            auVar37._28_4_ = fVar2 + auVar44._28_4_;
            uVar21 = vcmpps_avx512vl(auVar39,auVar37,6);
            uVar22 = vcmpps_avx512vl(*(undefined1 (*) [32])(uVar36 + 0xa0),auVar16,1);
            auVar15._4_4_ = fVar3 + auVar45._4_4_;
            auVar15._0_4_ = fVar3 + auVar45._0_4_;
            auVar15._8_4_ = fVar3 + auVar45._8_4_;
            auVar15._12_4_ = fVar3 + auVar45._12_4_;
            auVar15._16_4_ = fVar3 + auVar45._16_4_;
            auVar15._20_4_ = fVar3 + auVar45._20_4_;
            auVar15._24_4_ = fVar3 + auVar45._24_4_;
            auVar15._28_4_ = fVar3 + auVar45._28_4_;
            uVar23 = vcmpps_avx512vl(*(undefined1 (*) [32])(uVar36 + 0x80),auVar15,6);
            uVar24 = vcmpps_avx512vl(*(undefined1 (*) [32])(uVar36 + 0xe0),auVar17,1);
            uVar25 = vcmpps_avx512vl(*(undefined1 (*) [32])(uVar36 + 0xc0),auVar46,6);
            This = (Intersectors *)
                   (ulong)(byte)(~((byte)uVar23 | (byte)uVar21 | (byte)uVar25 | (byte)uVar20 |
                                  (byte)uVar22 | (byte)uVar24) & (byte)uVar19);
          }
          if ((uVar36 & 8) == 0) {
            if (This == (Intersectors *)0x0) {
              iVar29 = 4;
            }
            else {
              auVar39 = *(undefined1 (*) [32])(uVar36 & 0xfffffffffffffff0);
              auVar15 = ((undefined1 (*) [32])(uVar36 & 0xfffffffffffffff0))[1];
              auVar51 = in_ZMM7._0_32_;
              auVar37 = vpternlogd_avx512vl(auVar55._0_32_,auVar51,auVar56._0_32_,0xf8);
              uVar36 = (ulong)This & 0xffffffff;
              auVar38 = vpcompressd_avx512vl(auVar37);
              bVar26 = (bool)((byte)uVar36 & 1);
              auVar41._0_4_ = (uint)bVar26 * auVar38._0_4_ | (uint)!bVar26 * auVar37._0_4_;
              bVar26 = (bool)((byte)(uVar36 >> 1) & 1);
              auVar41._4_4_ = (uint)bVar26 * auVar38._4_4_ | (uint)!bVar26 * auVar37._4_4_;
              bVar26 = (bool)((byte)(uVar36 >> 2) & 1);
              auVar41._8_4_ = (uint)bVar26 * auVar38._8_4_ | (uint)!bVar26 * auVar37._8_4_;
              bVar26 = (bool)((byte)(uVar36 >> 3) & 1);
              auVar41._12_4_ = (uint)bVar26 * auVar38._12_4_ | (uint)!bVar26 * auVar37._12_4_;
              bVar26 = (bool)((byte)(uVar36 >> 4) & 1);
              auVar41._16_4_ = (uint)bVar26 * auVar38._16_4_ | (uint)!bVar26 * auVar37._16_4_;
              bVar26 = (bool)((byte)(uVar36 >> 5) & 1);
              auVar41._20_4_ = (uint)bVar26 * auVar38._20_4_ | (uint)!bVar26 * auVar37._20_4_;
              bVar26 = (bool)((byte)(uVar36 >> 6) & 1);
              auVar41._24_4_ = (uint)bVar26 * auVar38._24_4_ | (uint)!bVar26 * auVar37._24_4_;
              bVar26 = (bool)((byte)(uVar36 >> 7) & 1);
              auVar41._28_4_ = (uint)bVar26 * auVar38._28_4_ | (uint)!bVar26 * auVar37._28_4_;
              auVar37 = vpermt2q_avx512vl(auVar39,auVar41,auVar15);
              uVar36 = auVar37._0_8_;
              iVar29 = 0;
              uVar30 = (ulong)((long)&This[-1].intersector16_nofilter.name + 7U) & (ulong)This;
              if (uVar30 != 0) {
                auVar37 = vpshufd_avx2(auVar41,0x55);
                vpermt2q_avx512vl(auVar39,auVar37,auVar15);
                auVar38 = vpminsd_avx2(auVar41,auVar37);
                auVar37 = vpmaxsd_avx2(auVar41,auVar37);
                uVar30 = uVar30 - 1 & uVar30;
                if (uVar30 == 0) {
                  auVar38 = vpermi2q_avx512vl(auVar38,auVar39,auVar15);
                  uVar36 = auVar38._0_8_;
                  auVar39 = vpermt2q_avx512vl(auVar39,auVar37,auVar15);
                  *puVar32 = auVar39._0_8_;
                  auVar39 = vpermd_avx2(auVar37,auVar51);
                  *(int *)(puVar32 + 1) = auVar39._0_4_;
                  puVar32 = puVar32 + 2;
                }
                else {
                  auVar43 = vpshufd_avx2(auVar41,0xaa);
                  vpermt2q_avx512vl(auVar39,auVar43,auVar15);
                  auVar42 = vpminsd_avx2(auVar38,auVar43);
                  auVar38 = vpmaxsd_avx2(auVar38,auVar43);
                  auVar43 = vpminsd_avx2(auVar37,auVar38);
                  auVar37 = vpmaxsd_avx2(auVar37,auVar38);
                  uVar30 = uVar30 - 1 & uVar30;
                  if (uVar30 == 0) {
                    auVar38 = vpermi2q_avx512vl(auVar42,auVar39,auVar15);
                    uVar36 = auVar38._0_8_;
                    auVar38 = vpermt2q_avx512vl(auVar39,auVar37,auVar15);
                    *puVar32 = auVar38._0_8_;
                    auVar37 = vpermd_avx2(auVar37,auVar51);
                    *(int *)(puVar32 + 1) = auVar37._0_4_;
                    auVar39 = vpermt2q_avx512vl(auVar39,auVar43,auVar15);
                    puVar32[2] = auVar39._0_8_;
                    auVar39 = vpermd_avx2(auVar43,auVar51);
                    *(int *)(puVar32 + 3) = auVar39._0_4_;
                    puVar32 = puVar32 + 4;
                  }
                  else {
                    auVar38 = vpshufd_avx2(auVar41,0xff);
                    vpermt2q_avx512vl(auVar39,auVar38,auVar15);
                    auVar47 = vpminsd_avx2(auVar42,auVar38);
                    auVar38 = vpmaxsd_avx2(auVar42,auVar38);
                    auVar42 = vpminsd_avx2(auVar43,auVar38);
                    auVar38 = vpmaxsd_avx2(auVar43,auVar38);
                    auVar43 = vpminsd_avx2(auVar37,auVar38);
                    auVar37 = vpmaxsd_avx2(auVar37,auVar38);
                    uVar30 = uVar30 - 1 & uVar30;
                    if (uVar30 == 0) {
                      auVar38 = vpermi2q_avx512vl(auVar47,auVar39,auVar15);
                      uVar36 = auVar38._0_8_;
                      auVar38 = vpermt2q_avx512vl(auVar39,auVar37,auVar15);
                      *puVar32 = auVar38._0_8_;
                      auVar37 = vpermd_avx2(auVar37,auVar51);
                      *(int *)(puVar32 + 1) = auVar37._0_4_;
                      auVar37 = vpermt2q_avx512vl(auVar39,auVar43,auVar15);
                      puVar32[2] = auVar37._0_8_;
                      auVar37 = vpermd_avx2(auVar43,auVar51);
                      *(int *)(puVar32 + 3) = auVar37._0_4_;
                      auVar39 = vpermt2q_avx512vl(auVar39,auVar42,auVar15);
                      puVar32[4] = auVar39._0_8_;
                      auVar39 = vpermd_avx2(auVar42,auVar51);
                      *(int *)(puVar32 + 5) = auVar39._0_4_;
                      puVar32 = puVar32 + 6;
                    }
                    else {
                      auVar40 = valignd_avx512vl(auVar41,auVar41,3);
                      auVar38 = vpmovsxbd_avx2(ZEXT816(0x303020108));
                      auVar41 = vpermt2d_avx512vl(ZEXT1632(CONCAT412(0x80000000,
                                                                     CONCAT48(0x80000000,
                                                                              0x8000000080000000))),
                                                  auVar38,auVar47);
                      auVar38 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
                      auVar42 = vpermt2d_avx512vl(auVar41,auVar38,auVar42);
                      auVar42 = vpermt2d_avx512vl(auVar42,auVar38,auVar43);
                      auVar38 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
                      auVar37 = vpermt2d_avx512vl(auVar42,auVar38,auVar37);
                      auVar48 = ZEXT3264(auVar37);
                      uVar36 = uVar30;
                      do {
                        auVar38 = auVar48._0_32_;
                        auVar47._8_4_ = 1;
                        auVar47._0_8_ = 0x100000001;
                        auVar47._12_4_ = 1;
                        auVar47._16_4_ = 1;
                        auVar47._20_4_ = 1;
                        auVar47._24_4_ = 1;
                        auVar47._28_4_ = 1;
                        auVar37 = vpermd_avx2(auVar47,auVar40);
                        auVar40 = valignd_avx512vl(auVar40,auVar40,1);
                        vpermt2q_avx512vl(auVar39,auVar40,auVar15);
                        uVar36 = uVar36 - 1 & uVar36;
                        uVar19 = vpcmpd_avx512vl(auVar37,auVar38,5);
                        auVar37 = vpmaxsd_avx2(auVar37,auVar38);
                        bVar27 = (byte)uVar19 << 1;
                        auVar38 = valignd_avx512vl(auVar38,auVar38,7);
                        bVar26 = (bool)((byte)uVar19 & 1);
                        auVar43._4_4_ = (uint)bVar26 * auVar38._4_4_ | (uint)!bVar26 * auVar37._4_4_
                        ;
                        auVar43._0_4_ = auVar37._0_4_;
                        bVar26 = (bool)(bVar27 >> 2 & 1);
                        auVar43._8_4_ = (uint)bVar26 * auVar38._8_4_ | (uint)!bVar26 * auVar37._8_4_
                        ;
                        bVar26 = (bool)(bVar27 >> 3 & 1);
                        auVar43._12_4_ =
                             (uint)bVar26 * auVar38._12_4_ | (uint)!bVar26 * auVar37._12_4_;
                        bVar26 = (bool)(bVar27 >> 4 & 1);
                        auVar43._16_4_ =
                             (uint)bVar26 * auVar38._16_4_ | (uint)!bVar26 * auVar37._16_4_;
                        bVar26 = (bool)(bVar27 >> 5 & 1);
                        auVar43._20_4_ =
                             (uint)bVar26 * auVar38._20_4_ | (uint)!bVar26 * auVar37._20_4_;
                        bVar26 = (bool)(bVar27 >> 6 & 1);
                        auVar43._24_4_ =
                             (uint)bVar26 * auVar38._24_4_ | (uint)!bVar26 * auVar37._24_4_;
                        auVar43._28_4_ =
                             (uint)(bVar27 >> 7) * auVar38._28_4_ |
                             (uint)!(bool)(bVar27 >> 7) * auVar37._28_4_;
                        auVar48 = ZEXT3264(auVar43);
                      } while (uVar36 != 0);
                      lVar31 = POPCOUNT(uVar30) + 3;
                      do {
                        auVar37 = vpermi2q_avx512vl(auVar43,auVar39,auVar15);
                        *puVar32 = auVar37._0_8_;
                        auVar38 = auVar48._0_32_;
                        auVar37 = vpermd_avx2(auVar38,auVar51);
                        *(int *)(puVar32 + 1) = auVar37._0_4_;
                        auVar43 = valignd_avx512vl(auVar38,auVar38,1);
                        puVar32 = puVar32 + 2;
                        auVar48 = ZEXT3264(auVar43);
                        lVar31 = lVar31 + -1;
                      } while (lVar31 != 0);
                      auVar39 = vpermt2q_avx512vl(auVar39,auVar43,auVar15);
                      uVar36 = auVar39._0_8_;
                    }
                    in_ZMM7 = ZEXT3264(auVar51);
                    in_ZMM10 = ZEXT3264(in_ZMM10._0_32_);
                    iVar29 = 0;
                  }
                }
              }
            }
          }
          else {
            iVar29 = 6;
          }
        } while (iVar29 == 0);
      } while ((iVar29 != 6) || (uVar30 = (ulong)((uint)uVar36 & 0xf), uVar30 == 8));
      lVar31 = (uVar36 & 0xfffffffffffffff0) + 0x50;
      lVar35 = 0;
      bVar27 = 0;
      do {
        bVar33 = 0;
        lVar34 = 0;
        do {
          if (*(int *)(lVar31 + lVar34 * 4) == -1) break;
          uVar7 = *(uint *)(lVar31 + -0x10 + lVar34 * 4);
          this = (context->scene->geometries).items[uVar7].ptr;
          context->geomID = uVar7;
          context->primID = *(uint *)(lVar31 + lVar34 * 4);
          bVar26 = Geometry::pointQuery(this,query,context);
          bVar33 = bVar33 | bVar26;
          lVar34 = lVar34 + 1;
        } while (lVar34 != 4);
        bVar27 = bVar27 | bVar33;
        lVar35 = lVar35 + 1;
        lVar31 = lVar31 + 0x60;
      } while (lVar35 != uVar30 - 8);
      auVar53 = ZEXT1664(auVar52);
      auVar39 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
      auVar55 = ZEXT3264(auVar39);
      auVar56 = ZEXT3264(CONCAT428(0xfffffff8,
                                   CONCAT424(0xfffffff8,
                                             CONCAT420(0xfffffff8,
                                                       CONCAT416(0xfffffff8,
                                                                 CONCAT412(0xfffffff8,
                                                                           CONCAT48(0xfffffff8,
                                                                                                                                                                        
                                                  0xfffffff8fffffff8)))))));
      in_ZMM7 = ZEXT3264(in_ZMM7._0_32_);
      in_ZMM10 = ZEXT3264(auVar54._0_32_);
    } while (bVar27 == 0);
    uVar5 = *(undefined4 *)&(context->query_radius).field_0;
    auVar44._4_4_ = uVar5;
    auVar44._0_4_ = uVar5;
    auVar44._8_4_ = uVar5;
    auVar44._12_4_ = uVar5;
    auVar44._16_4_ = uVar5;
    auVar44._20_4_ = uVar5;
    auVar44._24_4_ = uVar5;
    auVar44._28_4_ = uVar5;
    uVar5 = *(undefined4 *)((long)&(context->query_radius).field_0 + 4);
    auVar45._4_4_ = uVar5;
    auVar45._0_4_ = uVar5;
    auVar45._8_4_ = uVar5;
    auVar45._12_4_ = uVar5;
    auVar45._16_4_ = uVar5;
    auVar45._20_4_ = uVar5;
    auVar45._24_4_ = uVar5;
    auVar45._28_4_ = uVar5;
    uVar5 = *(undefined4 *)((long)&(context->query_radius).field_0 + 8);
    auVar39._4_4_ = uVar5;
    auVar39._0_4_ = uVar5;
    auVar39._8_4_ = uVar5;
    auVar39._12_4_ = uVar5;
    auVar39._16_4_ = uVar5;
    auVar39._20_4_ = uVar5;
    auVar39._24_4_ = uVar5;
    auVar39._28_4_ = uVar5;
    if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
      auVar53 = ZEXT464((uint)(query->radius * query->radius));
    }
    else {
      aVar6 = (context->query_radius).field_0;
      auVar52 = vdpps_avx((undefined1  [16])aVar6,(undefined1  [16])aVar6,0x7f);
      auVar53 = ZEXT1664(auVar52);
    }
    bVar28 = true;
  } while( true );
}

Assistant:

static __forceinline bool pointQuery(const Accel::Intersectors* This, PointQuery* query, PointQueryContext* context)
      {
        const BVH* __restrict__ bvh = (const BVH*)This->ptr;
        
        /* we may traverse an empty BVH in case all geometry was invalid */
        if (bvh->root == BVH::emptyNode)
          return false;
        
        /* stack state */
        StackItemT<NodeRef> stack[stackSize];    // stack of nodes
        StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
        StackItemT<NodeRef>* stackEnd = stack+stackSize;
        stack[0].ptr  = bvh->root;
        stack[0].dist = neg_inf;
        
        /* verify correct input */
        assert(!(types & BVH_MB) || (query->time >= 0.0f && query->time <= 1.0f));

        /* load the point query into SIMD registers */
        TravPointQuery<N> tquery(query->p, context->query_radius);

        /* initialize the node traverser */
        BVHNNodeTraverser1Hit<N,types> nodeTraverser;

        bool changed = false;
        float cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                          ? query->radius * query->radius
                          : dot(context->query_radius, context->query_radius);

        /* pop loop */
        while (true) pop:
        {
          /* pop next node */
          if (unlikely(stackPtr == stack)) break;
          stackPtr--;
          NodeRef cur = NodeRef(stackPtr->ptr);

          /* if popped node is too far, pop next one */
          if (unlikely(*(float*)&stackPtr->dist > cull_radius))
            continue;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(point_query.trav_nodes,1,1,1);
            bool nodeIntersected;
            if (likely(context->query_type == POINT_QUERY_TYPE_SPHERE)) {
              nodeIntersected = BVHNNodePointQuerySphere1<N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            } else {
              nodeIntersected = BVHNNodePointQueryAABB1  <N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            }
            if (unlikely(!nodeIntersected)) { STAT3(point_query.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(point_query.trav_leaves,1,1,1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
          size_t lazy_node = 0;
          if (PrimitiveIntersector1::pointQuery(This, query, context, prim, num, tquery, lazy_node))
          {
            changed = true;
            tquery.rad = context->query_radius;
            cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                        ? query->radius * query->radius
                        : dot(context->query_radius, context->query_radius);
          }

          /* push lazy node onto stack */
          if (unlikely(lazy_node)) {
            stackPtr->ptr = lazy_node;
            stackPtr->dist = neg_inf;
            stackPtr++;
          }
        }
        return changed;
      }